

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5600a9::Nrom_has_the_correct_cpu_address_space_Test::TestBody
          (Nrom_has_the_correct_cpu_address_space_Test *this)

{
  Mapper in_R8D;
  char *in_R9;
  pointer *__ptr;
  unique_ptr<n_e_s::core::IRom,_std::default_delete<n_e_s::core::IRom>_> nrom;
  AssertionResult gtest_ar_;
  string bytes;
  stringstream ss;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_200;
  AssertHelper local_1f8;
  long *local_1f0;
  internal local_1e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  string local_1d8;
  string local_1b8;
  stringstream local_198 [128];
  ios_base local_118 [264];
  
  (anonymous_namespace)::nrom_bytes_abi_cxx11_
            (&local_1b8,(_anonymous_namespace_ *)0x1,'\x01','\0',in_R8D);
  std::__cxx11::stringstream::stringstream(local_198,(string *)&local_1b8,_S_out|_S_in);
  n_e_s::core::RomFactory::from_bytes((RomFactory *)&local_1f0,(istream *)local_198);
  local_1e8[0] = (internal)(**(code **)(*local_1f0 + 0x10))(local_1f0,0x6000);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,local_1e8,(AssertionResult *)"nrom->is_cpu_address_in_range(0x6000)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x65,local_1d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
  }
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e0,local_1e0);
  }
  local_1e8[0] = (internal)(**(code **)(*local_1f0 + 0x10))(local_1f0,0xffff);
  local_1e0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_1e8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_200);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d8,local_1e8,(AssertionResult *)"nrom->is_cpu_address_in_range(0xFFFF)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_rom.cpp"
               ,0x66,local_1d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_1f8,(Message *)&local_200);
    testing::internal::AssertHelper::~AssertHelper(&local_1f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (local_200._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_200._M_head_impl + 8))();
    }
  }
  if (local_1e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1e0,local_1e0);
  }
  if (local_1f0 != (long *)0x0) {
    (**(code **)(*local_1f0 + 8))();
  }
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(Nrom, has_the_correct_cpu_address_space) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Nrom)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> nrom{RomFactory::from_bytes(ss)};
    EXPECT_TRUE(nrom->is_cpu_address_in_range(0x6000));
    EXPECT_TRUE(nrom->is_cpu_address_in_range(0xFFFF));
}